

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  string_view_t view_00;
  memory_buf_t *in_RCX;
  long in_RDI;
  null_scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar3;
  basic_string_view<char> *in_stack_ffffffffffffffa8;
  memory_buf_t *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar4;
  size_t in_stack_ffffffffffffffc0;
  memory_buf_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int n;
  
  n = 0;
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffd7,0x18,(padding_info *)(in_RDI + 8),in_RCX
            );
  std::array<const_char_*,_7UL>::operator[]
            ((array<const_char_*,_7UL> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,
                               CONCAT15(in_stack_ffffffffffffffa5,
                                        CONCAT14(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                )))),(size_type)in_stack_ffffffffffffff98);
  ::fmt::v11::basic_string_view<char>::basic_string_view
            (in_stack_ffffffffffffffa8,
             (char *)CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,
                                       CONCAT15(in_stack_ffffffffffffffa5,
                                                CONCAT14(in_stack_ffffffffffffffa4,
                                                         in_stack_ffffffffffffffa0)))));
  view.data_._7_1_ = in_stack_ffffffffffffffbf;
  view.data_._0_7_ = in_stack_ffffffffffffffb8;
  view.size_ = in_stack_ffffffffffffffc0;
  fmt_helper::append_string_view(view,in_stack_ffffffffffffffb0);
  uVar4 = 0x20;
  ::fmt::v11::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,
                               CONCAT15(in_stack_ffffffffffffffa5,
                                        CONCAT14(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                )))),in_stack_ffffffffffffff98);
  std::array<const_char_*,_12UL>::operator[]
            ((array<const_char_*,_12UL> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,
                               CONCAT15(in_stack_ffffffffffffffa5,
                                        CONCAT14(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                )))),(size_type)in_stack_ffffffffffffff98);
  ::fmt::v11::basic_string_view<char>::basic_string_view
            (in_stack_ffffffffffffffa8,
             (char *)CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,
                                       CONCAT15(in_stack_ffffffffffffffa5,
                                                CONCAT14(in_stack_ffffffffffffffa4,
                                                         in_stack_ffffffffffffffa0)))));
  view_00.data_._7_1_ = uVar4;
  view_00.data_._0_7_ = in_stack_ffffffffffffffb8;
  view_00.size_ = in_stack_ffffffffffffffc0;
  fmt_helper::append_string_view(view_00,in_stack_ffffffffffffffb0);
  uVar3 = 0x20;
  ::fmt::v11::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(0x20,CONCAT16(in_stack_ffffffffffffffa6,
                                    CONCAT15(in_stack_ffffffffffffffa5,
                                             CONCAT14(in_stack_ffffffffffffffa4,
                                                      in_stack_ffffffffffffffa0)))),
             in_stack_ffffffffffffff98);
  fmt_helper::append_int<int>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  uVar2 = 0x20;
  ::fmt::v11::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(uVar3,CONCAT16(0x20,CONCAT15(in_stack_ffffffffffffffa5,
                                                   CONCAT14(in_stack_ffffffffffffffa4,
                                                            in_stack_ffffffffffffffa0)))),
             in_stack_ffffffffffffff98);
  fmt_helper::pad2(n,(memory_buf_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar1 = 0x3a;
  ::fmt::v11::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(0x3a,CONCAT14(in_stack_ffffffffffffffa4,
                                                                  in_stack_ffffffffffffffa0)))),
             in_stack_ffffffffffffff98);
  fmt_helper::pad2(n,(memory_buf_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar4 = 0x3a;
  ::fmt::v11::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,CONCAT14(0x3a,in_stack_ffffffffffffffa0)))
                     ),in_stack_ffffffffffffff98);
  fmt_helper::pad2(n,(memory_buf_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  ::fmt::v11::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,CONCAT14(uVar4,CONCAT13(0x20,(int3)
                                                  in_stack_ffffffffffffffa0))))),
             in_stack_ffffffffffffff98);
  fmt_helper::append_int<int>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }